

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O3

aiMesh * __thiscall
Assimp::MMDImporter::CreateMesh(MMDImporter *this,PmxModel *pModel,int indexStart,int indexCount)

{
  pointer *ppaVar1;
  PmxBone *pPVar2;
  size_t sVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  PmxVertex *pPVar7;
  aiVector3D *paVar8;
  _Head_base<0UL,_pmx::PmxVertexSkinning_*,_false> _Var9;
  PmxBone *pPVar10;
  aiVertexWeight aVar11;
  aiVertexWeight aVar12;
  aiVertexWeight aVar13;
  aiVertexWeight aVar14;
  aiVertexWeight aVar15;
  aiVertexWeight aVar16;
  aiVertexWeight aVar17;
  aiVertexWeight aVar18;
  aiVertexWeight aVar19;
  _Base_ptr p_Var20;
  aiMesh *paVar21;
  ulong *puVar22;
  aiFace *paVar23;
  int *piVar24;
  aiVector3D *paVar25;
  long lVar26;
  mapped_type *pmVar27;
  aiBone **ppaVar28;
  aiBone *paVar29;
  aiVertexWeight *__s;
  aiFace *paVar30;
  float *pfVar31;
  _Base_ptr p_Var32;
  ulong uVar33;
  long lVar34;
  iterator iVar35;
  ulong uVar36;
  int iVar37;
  uint uVar38;
  PmxModel *pPVar39;
  _Base_ptr p_Var40;
  _Base_ptr p_Var41;
  ulong uVar42;
  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  bone_vertex_map;
  aiVertexWeight local_98;
  ulong local_90;
  size_t local_88;
  PmxModel *local_80;
  aiBone **local_78;
  long local_70;
  ulong local_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  local_60;
  
  local_88 = CONCAT44(local_88._4_4_,indexStart);
  local_80 = pModel;
  paVar21 = (aiMesh *)operator_new(0x520);
  paVar21->mPrimitiveTypes = 0;
  memset(&paVar21->mVertices,0,0xcc);
  paVar21->mBones = (aiBone **)0x0;
  paVar21->mMaterialIndex = 0;
  (paVar21->mName).length = 0;
  (paVar21->mName).data[0] = '\0';
  memset((paVar21->mName).data + 1,0x1b,0x3ff);
  paVar21->mNumAnimMeshes = 0;
  paVar21->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar21->mMethod = 0;
  (paVar21->mAABB).mMin.x = 0.0;
  (paVar21->mAABB).mMin.y = 0.0;
  (paVar21->mAABB).mMin.z = 0.0;
  (paVar21->mAABB).mMax.x = 0.0;
  (paVar21->mAABB).mMax.y = 0.0;
  (paVar21->mAABB).mMax.z = 0.0;
  memset(paVar21->mColors,0,0xa0);
  paVar21->mNumVertices = indexCount;
  local_90 = CONCAT44(local_90._4_4_,indexCount);
  uVar38 = indexCount / 3;
  uVar36 = (ulong)uVar38;
  paVar21->mNumFaces = uVar38;
  puVar22 = (ulong *)operator_new__(uVar36 * 0x10 + 8);
  *puVar22 = uVar36;
  paVar23 = (aiFace *)(puVar22 + 1);
  if (indexCount + 2U < 5) {
    paVar21->mFaces = paVar23;
  }
  else {
    paVar30 = paVar23;
    do {
      paVar30->mNumIndices = 0;
      paVar30->mIndices = (uint *)0x0;
      paVar30 = paVar30 + 1;
    } while (paVar30 != paVar23 + uVar36);
    paVar21->mFaces = paVar23;
    if (4 < indexCount + 2U) {
      uVar36 = 1;
      if (1 < uVar38) {
        uVar36 = (ulong)uVar38;
      }
      lVar26 = 0;
      do {
        *(undefined4 *)(puVar22 + 1) = 3;
        piVar24 = (int *)operator_new__(0xc);
        iVar37 = (int)lVar26;
        *piVar24 = iVar37;
        piVar24[1] = iVar37 + 1;
        piVar24[2] = iVar37 + 2;
        puVar22[2] = (ulong)piVar24;
        lVar26 = lVar26 + 3;
        puVar22 = puVar22 + 2;
      } while (uVar36 * 3 != lVar26);
    }
  }
  iVar37 = (int)local_90;
  local_68 = local_90 & 0xffffffff;
  uVar36 = local_68 * 0xc;
  paVar25 = (aiVector3D *)operator_new__(uVar36);
  if (iVar37 == 0) {
    paVar21->mVertices = paVar25;
    paVar25 = (aiVector3D *)operator_new__(uVar36);
    paVar21->mNormals = paVar25;
    paVar25 = (aiVector3D *)operator_new__(uVar36);
  }
  else {
    sVar3 = ((uVar36 - 0xc) / 0xc) * 0xc + 0xc;
    memset(paVar25,0,sVar3);
    paVar21->mVertices = paVar25;
    paVar25 = (aiVector3D *)operator_new__(uVar36);
    memset(paVar25,0,sVar3);
    paVar21->mNormals = paVar25;
    paVar25 = (aiVector3D *)operator_new__(uVar36);
    memset(paVar25,0,sVar3);
  }
  paVar21->mTextureCoords[0] = paVar25;
  paVar21->mNumUVComponents[0] = 2;
  uVar33 = (ulong)(local_80->setting).uv;
  if (uVar33 != 0) {
    uVar42 = 0;
    do {
      paVar25 = (aiVector3D *)operator_new__(uVar36);
      if ((int)local_90 != 0) {
        memset(paVar25,0,((uVar36 - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar21->mTextureCoords[uVar42 + 1] = paVar25;
      paVar21->mNumUVComponents[uVar42 + 1] = 4;
      uVar42 = uVar42 + 1;
    } while (uVar33 != uVar42);
  }
  pPVar39 = local_80;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)local_90) {
    local_70 = (long)(int)local_88;
    uVar36 = 0;
    do {
      iVar37 = (pPVar39->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar36 + local_70];
      pPVar7 = (pPVar39->vertices)._M_t.
               super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
               super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
               super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl;
      paVar8 = paVar21->mVertices;
      fVar4 = pPVar7[iVar37].position[2];
      fVar5 = pPVar7[iVar37].position[1];
      paVar25 = paVar8 + uVar36;
      paVar25->x = pPVar7[iVar37].position[0];
      paVar25->y = fVar5;
      paVar8[uVar36].z = fVar4;
      paVar8 = paVar21->mNormals;
      fVar4 = pPVar7[iVar37].normal[2];
      fVar5 = pPVar7[iVar37].normal[1];
      paVar25 = paVar8 + uVar36;
      paVar25->x = pPVar7[iVar37].normal[0];
      paVar25->y = fVar5;
      paVar8[uVar36].z = fVar4;
      paVar25 = paVar21->mTextureCoords[0];
      paVar25[uVar36].x = pPVar7[iVar37].uv[0];
      paVar25[uVar36].y = pPVar7[iVar37].uv[1];
      if ((pPVar39->setting).uv != '\0') {
        pfVar31 = (float *)((long)(pPVar7[iVar37].uva + 1) + 4);
        uVar33 = 0;
        do {
          paVar25 = paVar21->mTextureCoords[uVar33 + 1];
          paVar25[uVar36].x = (*(float (*) [4])(pfVar31 + -1))[0];
          paVar25[uVar36].y = *pfVar31;
          uVar33 = uVar33 + 1;
          pfVar31 = pfVar31 + 4;
        } while (uVar33 < (pPVar39->setting).uv);
      }
      _Var9._M_head_impl =
           *(PmxVertexSkinning **)
            &pPVar7[iVar37].skinning._M_t.
             super___uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
      ;
      if ((tuple<pmx::PmxVertexSkinning_*,_std::default_delete<pmx::PmxVertexSkinning>_>)
          _Var9._M_head_impl == (_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)0x0) {
        local_90 = 0;
        local_78 = (aiBone **)0x0;
        local_88 = 0;
        lVar26 = 0;
      }
      else {
        local_78 = (aiBone **)
                   __dynamic_cast(_Var9._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF1::typeinfo,0);
        local_88 = __dynamic_cast(_Var9._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF2::typeinfo,0);
        local_90 = __dynamic_cast(_Var9._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningBDEF4::typeinfo,0);
        lVar26 = __dynamic_cast(_Var9._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                &pmx::PmxVertexSkinningSDEF::typeinfo,0);
      }
      sVar3 = local_88;
      uVar33 = local_90;
      uVar38 = (uint)uVar36;
      switch(pPVar7[iVar37].skinning_type) {
      case BDEF1:
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(local_78 + 1));
        local_98.mWeight = 1.0;
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current ==
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_98.mVertexId = uVar38;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        }
        else {
LAB_00668b6f:
          aVar19.mWeight = local_98.mWeight;
          aVar19.mVertexId = uVar38;
          *iVar35._M_current = aVar19;
          ppaVar1 = &(pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_98.mVertexId = uVar38;
        }
        break;
      case BDEF2:
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(local_88 + 8));
        local_98.mWeight = *(float *)(sVar3 + 0x10);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current ==
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_98.mVertexId = uVar38;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        }
        else {
          aVar13.mWeight = local_98.mWeight;
          aVar13.mVertexId = uVar38;
          *iVar35._M_current = aVar13;
          ppaVar1 = &(pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_98.mVertexId = uVar38;
        }
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(sVar3 + 0xc));
        local_98.mWeight = 1.0 - *(float *)(sVar3 + 0x10);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current !=
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00668b6f;
        local_98.mVertexId = uVar38;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
        _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        break;
      case BDEF4:
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(local_90 + 8));
        local_98.mWeight = *(float *)(uVar33 + 0x18);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current ==
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_98.mVertexId = uVar38;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        }
        else {
          aVar11.mWeight = local_98.mWeight;
          aVar11.mVertexId = uVar38;
          *iVar35._M_current = aVar11;
          ppaVar1 = &(pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_98.mVertexId = uVar38;
        }
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(uVar33 + 0xc));
        local_98.mWeight = *(float *)(uVar33 + 0x1c);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current ==
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_98.mVertexId = uVar38;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        }
        else {
          aVar16.mWeight = local_98.mWeight;
          aVar16.mVertexId = uVar38;
          *iVar35._M_current = aVar16;
          ppaVar1 = &(pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_98.mVertexId = uVar38;
        }
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(uVar33 + 0x10));
        local_98.mWeight = *(float *)(uVar33 + 0x20);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current ==
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_98.mVertexId = uVar38;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        }
        else {
          aVar18.mWeight = local_98.mWeight;
          aVar18.mVertexId = uVar38;
          *iVar35._M_current = aVar18;
          ppaVar1 = &(pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_98.mVertexId = uVar38;
        }
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(uVar33 + 0x14));
        local_98.mWeight = *(float *)(uVar33 + 0x24);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current !=
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00668b6f;
        local_98.mVertexId = uVar38;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
        _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        break;
      case SDEF:
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar26 + 8));
        local_98.mWeight = *(float *)(lVar26 + 0x10);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current ==
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_98.mVertexId = uVar38;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        }
        else {
          aVar12.mWeight = local_98.mWeight;
          aVar12.mVertexId = uVar38;
          *iVar35._M_current = aVar12;
          ppaVar1 = &(pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_98.mVertexId = uVar38;
        }
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar26 + 0xc));
        local_98.mWeight = 1.0 - *(float *)(lVar26 + 0x10);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current !=
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00668b6f;
        local_98.mVertexId = uVar38;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
        _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        break;
      case QDEF:
        if ((_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)_Var9._M_head_impl ==
            (_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)0x0) {
          lVar26 = 0;
        }
        else {
          lVar26 = __dynamic_cast(_Var9._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                  &pmx::PmxVertexSkinningQDEF::typeinfo,0);
        }
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar26 + 8));
        local_98.mWeight = *(float *)(lVar26 + 0x18);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current ==
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_98.mVertexId = uVar38;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        }
        else {
          aVar14.mWeight = local_98.mWeight;
          aVar14.mVertexId = uVar38;
          *iVar35._M_current = aVar14;
          ppaVar1 = &(pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_98.mVertexId = uVar38;
        }
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar26 + 0xc));
        local_98.mWeight = *(float *)(lVar26 + 0x1c);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current ==
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_98.mVertexId = uVar38;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        }
        else {
          aVar15.mWeight = local_98.mWeight;
          aVar15.mVertexId = uVar38;
          *iVar35._M_current = aVar15;
          ppaVar1 = &(pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_98.mVertexId = uVar38;
        }
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar26 + 0x10));
        local_98.mWeight = *(float *)(lVar26 + 0x20);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current ==
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_98.mVertexId = uVar38;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
          _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
        }
        else {
          aVar17.mWeight = local_98.mWeight;
          aVar17.mVertexId = uVar38;
          *iVar35._M_current = aVar17;
          ppaVar1 = &(pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          local_98.mVertexId = uVar38;
        }
        pmVar27 = std::
                  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                  ::operator[]((map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                                *)&local_60,(key_type_conflict2 *)(lVar26 + 0x14));
        local_98.mWeight = *(float *)(lVar26 + 0x24);
        iVar35._M_current =
             (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar35._M_current !=
            (pmVar27->super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_00668b6f;
        local_98.mVertexId = uVar38;
        std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::
        _M_realloc_insert<aiVertexWeight>(pmVar27,iVar35,&local_98);
      }
      uVar36 = uVar36 + 1;
    } while (uVar36 != local_68);
  }
  uVar38 = pPVar39->bone_count;
  uVar33 = (ulong)(int)uVar38;
  uVar36 = 0xffffffffffffffff;
  if (-1 < (long)uVar33) {
    uVar36 = uVar33 * 8;
  }
  ppaVar28 = (aiBone **)operator_new__(uVar36);
  paVar21->mNumBones = uVar38;
  paVar21->mBones = ppaVar28;
  local_90 = uVar33;
  if (0 < (int)uVar38) {
    lVar26 = 0;
    local_78 = ppaVar28;
    do {
      paVar29 = (aiBone *)operator_new(0x450);
      (paVar29->mName).length = 0;
      (paVar29->mName).data[0] = '\0';
      memset((paVar29->mName).data + 1,0x1b,0x3ff);
      paVar29->mNumWeights = 0;
      paVar29->mWeights = (aiVertexWeight *)0x0;
      (paVar29->mOffsetMatrix).a1 = 1.0;
      (paVar29->mOffsetMatrix).a2 = 0.0;
      (paVar29->mOffsetMatrix).a3 = 0.0;
      (paVar29->mOffsetMatrix).a4 = 0.0;
      (paVar29->mOffsetMatrix).b1 = 0.0;
      (paVar29->mOffsetMatrix).b2 = 1.0;
      (paVar29->mOffsetMatrix).b3 = 0.0;
      (paVar29->mOffsetMatrix).b4 = 0.0;
      (paVar29->mOffsetMatrix).c1 = 0.0;
      (paVar29->mOffsetMatrix).c2 = 0.0;
      (paVar29->mOffsetMatrix).c3 = 1.0;
      (paVar29->mOffsetMatrix).c4 = 0.0;
      (paVar29->mOffsetMatrix).d1 = 0.0;
      (paVar29->mOffsetMatrix).d2 = 0.0;
      (paVar29->mOffsetMatrix).d3 = 0.0;
      (paVar29->mOffsetMatrix).d4 = 1.0;
      pPVar10 = (pPVar39->bones)._M_t.
                super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
                super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
                super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
      pPVar2 = pPVar10 + lVar26;
      uVar36 = pPVar10[lVar26].bone_name._M_string_length;
      if (uVar36 < 0x400) {
        (paVar29->mName).length = (ai_uint32)uVar36;
        memcpy((paVar29->mName).data,(pPVar2->bone_name)._M_dataplus._M_p,uVar36);
        (paVar29->mName).data[uVar36] = '\0';
      }
      fVar4 = pPVar2->position[0];
      fVar5 = pPVar2->position[1];
      fVar6 = pPVar2->position[2];
      (paVar29->mOffsetMatrix).a1 = 1.0;
      (paVar29->mOffsetMatrix).a2 = 0.0;
      (paVar29->mOffsetMatrix).a3 = 0.0;
      (paVar29->mOffsetMatrix).a4 = 0.0;
      (paVar29->mOffsetMatrix).b1 = 0.0;
      (paVar29->mOffsetMatrix).b2 = 1.0;
      (paVar29->mOffsetMatrix).b3 = 0.0;
      (paVar29->mOffsetMatrix).b4 = 0.0;
      (paVar29->mOffsetMatrix).c1 = 0.0;
      (paVar29->mOffsetMatrix).c2 = 0.0;
      (paVar29->mOffsetMatrix).c3 = 1.0;
      (paVar29->mOffsetMatrix).d3 = 0.0;
      (paVar29->mOffsetMatrix).d4 = 1.0;
      (paVar29->mOffsetMatrix).d1 = 0.0;
      (paVar29->mOffsetMatrix).d2 = 0.0;
      (paVar29->mOffsetMatrix).a4 = -fVar4;
      (paVar29->mOffsetMatrix).b4 = -fVar5;
      (paVar29->mOffsetMatrix).c4 = -fVar6;
      if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var20 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var41 = &local_60._M_impl.super__Rb_tree_header._M_header;
        do {
          p_Var40 = p_Var41;
          p_Var32 = p_Var20;
          lVar34 = (long)(int)p_Var32[1]._M_color;
          p_Var41 = p_Var32;
          if (lVar34 < lVar26) {
            p_Var41 = p_Var40;
          }
          p_Var20 = (&p_Var32->_M_left)[lVar34 < lVar26];
        } while ((&p_Var32->_M_left)[lVar34 < lVar26] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var41 != &local_60._M_impl.super__Rb_tree_header) {
          if (lVar34 < lVar26) {
            p_Var32 = p_Var40;
          }
          if ((int)p_Var32[1]._M_color <= lVar26) {
            uVar36 = (long)p_Var41[1]._M_left - (long)p_Var41[1]._M_parent >> 3;
            uVar38 = (uint)uVar36;
            paVar29->mNumWeights = uVar38;
            uVar36 = uVar36 & 0xffffffff;
            local_88 = uVar36 * 8;
            __s = (aiVertexWeight *)operator_new__(local_88);
            if (uVar36 != 0) {
              memset(__s,0,local_88);
            }
            paVar29->mWeights = __s;
            ppaVar28 = local_78;
            if (uVar38 != 0) {
              uVar36 = 0;
              do {
                paVar29->mWeights[uVar36] =
                     *(aiVertexWeight *)(&(p_Var41[1]._M_parent)->_M_color + uVar36 * 2);
                uVar36 = uVar36 + 1;
              } while (uVar36 < paVar29->mNumWeights);
              local_90 = (ulong)(uint)local_80->bone_count;
            }
          }
        }
      }
      ppaVar28[lVar26] = paVar29;
      lVar26 = lVar26 + 1;
      pPVar39 = local_80;
    } while (lVar26 < (int)local_90);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return paVar21;
}

Assistant:

aiMesh *MMDImporter::CreateMesh(const pmx::PmxModel *pModel,
                                const int indexStart, const int indexCount) {
  aiMesh *pMesh = new aiMesh;

  pMesh->mNumVertices = indexCount;

  pMesh->mNumFaces = indexCount / 3;
  pMesh->mFaces = new aiFace[pMesh->mNumFaces];

  const int numIndices = 3; // triangular face
  for (unsigned int index = 0; index < pMesh->mNumFaces; index++) {
    pMesh->mFaces[index].mNumIndices = numIndices;
    unsigned int *indices = new unsigned int[numIndices];
    indices[0] = numIndices * index;
    indices[1] = numIndices * index + 1;
    indices[2] = numIndices * index + 2;
    pMesh->mFaces[index].mIndices = indices;
  }

  pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
  pMesh->mTextureCoords[0] = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNumUVComponents[0] = 2;

  // additional UVs
  for (int i = 1; i <= pModel->setting.uv; i++) {
    pMesh->mTextureCoords[i] = new aiVector3D[pMesh->mNumVertices];
    pMesh->mNumUVComponents[i] = 4;
  }

  map<int, vector<aiVertexWeight>> bone_vertex_map;

  // fill in contents and create bones
  for (int index = 0; index < indexCount; index++) {
    const pmx::PmxVertex *v =
        &pModel->vertices[pModel->indices[indexStart + index]];
    const float *position = v->position;
    pMesh->mVertices[index].Set(position[0], position[1], position[2]);
    const float *normal = v->normal;

    pMesh->mNormals[index].Set(normal[0], normal[1], normal[2]);
    pMesh->mTextureCoords[0][index].x = v->uv[0];
    pMesh->mTextureCoords[0][index].y = v->uv[1];

    for (int i = 1; i <= pModel->setting.uv; i++) {
      // TODO: wrong here? use quaternion transform?
      pMesh->mTextureCoords[i][index].x = v->uva[i][0];
      pMesh->mTextureCoords[i][index].y = v->uva[i][1];
    }

    // handle bone map
    const auto vsBDEF1_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF1 *>(v->skinning.get());
    const auto vsBDEF2_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF2 *>(v->skinning.get());
    const auto vsBDEF4_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF4 *>(v->skinning.get());
    const auto vsSDEF_ptr =
        dynamic_cast<pmx::PmxVertexSkinningSDEF *>(v->skinning.get());
    switch (v->skinning_type) {
    case pmx::PmxVertexSkinningType::BDEF1:
      bone_vertex_map[vsBDEF1_ptr->bone_index].push_back(
          aiVertexWeight(index, 1.0));
      break;
    case pmx::PmxVertexSkinningType::BDEF2:
      bone_vertex_map[vsBDEF2_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF2_ptr->bone_weight));
      bone_vertex_map[vsBDEF2_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsBDEF2_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::BDEF4:
      bone_vertex_map[vsBDEF4_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight1));
      bone_vertex_map[vsBDEF4_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight2));
      bone_vertex_map[vsBDEF4_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight3));
      bone_vertex_map[vsBDEF4_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight4));
      break;
    case pmx::PmxVertexSkinningType::SDEF: // TODO: how to use sdef_c, sdef_r0,
                                           // sdef_r1?
      bone_vertex_map[vsSDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsSDEF_ptr->bone_weight));
      bone_vertex_map[vsSDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsSDEF_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::QDEF:
      const auto vsQDEF_ptr =
          dynamic_cast<pmx::PmxVertexSkinningQDEF *>(v->skinning.get());
      bone_vertex_map[vsQDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight1));
      bone_vertex_map[vsQDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight2));
      bone_vertex_map[vsQDEF_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight3));
      bone_vertex_map[vsQDEF_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight4));
      break;
    }
  }

  // make all bones for each mesh
  // assign bone weights to skinned bones (otherwise just initialize)
  auto bone_ptr_ptr = new aiBone *[pModel->bone_count];
  pMesh->mNumBones = pModel->bone_count;
  pMesh->mBones = bone_ptr_ptr;
  for (auto ii = 0; ii < pModel->bone_count; ++ii) {
    auto pBone = new aiBone;
    const auto &pmxBone = pModel->bones[ii];
    pBone->mName = pmxBone.bone_name;
    aiVector3D pos(pmxBone.position[0], pmxBone.position[1], pmxBone.position[2]);
    aiMatrix4x4::Translation(-pos, pBone->mOffsetMatrix);
    auto it = bone_vertex_map.find(ii);
    if (it != bone_vertex_map.end()) {
      pBone->mNumWeights = static_cast<unsigned int>(it->second.size());
      pBone->mWeights = new aiVertexWeight[pBone->mNumWeights];
      for (unsigned int j = 0; j < pBone->mNumWeights; j++) {
          pBone->mWeights[j] = it->second[j];
      }
    }
    bone_ptr_ptr[ii] = pBone;
  }

  return pMesh;
}